

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::check_extensions_supported
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                *available_extensions,
               vector<const_char_*,_std::allocator<const_char_*>_> *extension_names)

{
  bool bVar1;
  reference ppcVar2;
  bool found;
  char **extension_name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  bool all_found;
  vector<const_char_*,_std::allocator<const_char_*>_> *extension_names_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *available_extensions_local;
  
  __range2._7_1_ = true;
  __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(extension_names);
  extension_name =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(extension_names);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&extension_name);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end2);
    bVar1 = check_extension_supported(available_extensions,*ppcVar2);
    if (!bVar1) {
      __range2._7_1_ = false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end2);
  }
  return __range2._7_1_;
}

Assistant:

bool check_extensions_supported(
    std::vector<VkExtensionProperties> const& available_extensions, std::vector<const char*> const& extension_names) {
    bool all_found = true;
    for (const auto& extension_name : extension_names) {
        bool found = check_extension_supported(available_extensions, extension_name);
        if (!found) all_found = false;
    }
    return all_found;
}